

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p192(mbedtls_mpi *N)

{
  mbedtls_mpi_uint *dst;
  size_t sVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint *end;
  mbedtls_mpi_uint *p;
  mbedtls_mpi_uint c;
  mbedtls_mpi *pmStack_10;
  int ret;
  mbedtls_mpi *N_local;
  
  p = (mbedtls_mpi_uint *)0x0;
  pmStack_10 = N;
  c._4_4_ = mbedtls_mpi_grow(N,6);
  if (c._4_4_ == 0) {
    dst = pmStack_10->p;
    sVar1 = pmStack_10->n;
    add64(dst,pmStack_10->p + 3,(mbedtls_mpi_uint *)&p);
    add64(dst,pmStack_10->p + 5,(mbedtls_mpi_uint *)&p);
    pmVar2 = dst + 1;
    carry64(pmVar2,(mbedtls_mpi_uint *)&p);
    add64(pmVar2,pmStack_10->p + 3,(mbedtls_mpi_uint *)&p);
    add64(pmVar2,pmStack_10->p + 4,(mbedtls_mpi_uint *)&p);
    add64(pmVar2,pmStack_10->p + 5,(mbedtls_mpi_uint *)&p);
    pmVar2 = dst + 2;
    carry64(pmVar2,(mbedtls_mpi_uint *)&p);
    add64(pmVar2,pmStack_10->p + 4,(mbedtls_mpi_uint *)&p);
    add64(pmVar2,pmStack_10->p + 5,(mbedtls_mpi_uint *)&p);
    end = dst + 3;
    *end = (mbedtls_mpi_uint)p;
    while (end = end + 1, end < dst + sVar1) {
      *end = 0;
    }
  }
  return c._4_4_;
}

Assistant:

static int ecp_mod_p192( mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi_uint c = 0;
    mbedtls_mpi_uint *p, *end;

    /* Make sure we have enough blocks so that A(5) is legal */
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( N, 6 * WIDTH ) );

    p = N->p;
    end = p + N->n;

    ADD( 3 ); ADD( 5 );             NEXT; // A0 += A3 + A5
    ADD( 3 ); ADD( 4 ); ADD( 5 );   NEXT; // A1 += A3 + A4 + A5
    ADD( 4 ); ADD( 5 );             LAST; // A2 += A4 + A5

cleanup:
    return( ret );
}